

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_visualization.cpp
# Opt level: O3

void __thiscall lumeview::SubsetVisualization::prepare_renderer(SubsetVisualization *this)

{
  Renderer *this_00;
  pointer piVar1;
  Mesh *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  iterator __position;
  bool bVar2;
  int iVar3;
  index_t si;
  pointer psVar4;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  SPMesh local_b8;
  string local_a8;
  SPMesh local_88;
  string local_78;
  vector<int,_std::allocator<int>_> *local_58;
  pointer local_50;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_48;
  
  local_48._0_8_ = 0x3e4ccccd3e4ccccd;
  local_48._8_8_ = 0x3f8000003e4ccccd;
  piVar1 = (this->m_subsetIndexToStageIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_subsetIndexToStageIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->m_subsetIndexToStageIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  psVar4 = (this->m_subsetMeshes).
           super__Vector_base<std::shared_ptr<lume::Mesh>,_std::allocator<std::shared_ptr<lume::Mesh>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_50 = (this->m_subsetMeshes).
             super__Vector_base<std::shared_ptr<lume::Mesh>,_std::allocator<std::shared_ptr<lume::Mesh>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 != local_50) {
    local_58 = &this->m_subsetIndexToStageIndex;
    this_00 = &this->m_renderer;
    si = 0;
    do {
      this_01 = (psVar4->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_02 = (psVar4->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_02->_M_use_count = this_02->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_02->_M_use_count = this_02->_M_use_count + 1;
        }
      }
      iVar3 = (int)((ulong)((long)(this->m_renderer).m_stages.
                                  super__Vector_base<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_renderer).m_stages.
                                 super__Vector_base<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5) * -0x33333333;
      local_d8.field_0.x = (float)iVar3;
      __position._M_current =
           (this->m_subsetIndexToStageIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_subsetIndexToStageIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (local_58,__position,(int *)&local_d8);
      }
      else {
        *__position._M_current = iVar3;
        (this->m_subsetIndexToStageIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      bVar2 = lume::Mesh::has(this_01,(GrobSet)0x34);
      if (bVar2) {
        local_d8._0_8_ = &local_c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"normals","");
        lume::ComputeFaceVertexNormals3(this_01,(string *)&local_d8.field_0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._0_8_ != &local_c8) {
          operator_delete((void *)local_d8._0_8_,local_c8._M_allocated_capacity + 1);
        }
        lume::CreateSideGrobs(this_01,1);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"solid","");
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_02->_M_use_count = this_02->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_02->_M_use_count = this_02->_M_use_count + 1;
          }
        }
        local_88.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
        local_88.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             this_02;
        Renderer::add_stage(this_00,&local_78,&local_88,(GrobSet)0x34,FLAT);
        if (local_88.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        local_d8.field_0 =
             (anon_struct_16_4_d86d922e_for_anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2_0
              )subset_color(this,si);
        Renderer::stage_set_color(this_00,(vec4 *)&local_d8.field_0,-1);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"wire","");
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_02->_M_use_count = this_02->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_02->_M_use_count = this_02->_M_use_count + 1;
          }
        }
        local_b8.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
        local_b8.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             this_02;
        Renderer::add_stage(this_00,&local_a8,&local_b8,(GrobSet)0x4,FLAT);
        if (local_b8.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b8.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        Renderer::stage_set_color(this_00,(vec4 *)&local_48.field_0,-1);
      }
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
      }
      psVar4 = psVar4 + 1;
      si = si + 1;
    } while (psVar4 != local_50);
  }
  return;
}

Assistant:

void SubsetVisualization::prepare_renderer ()
{
	const glm::vec4 wireColor (0.2f, 0.2f, 0.2f, 1.0f);

	index_t subsetIndex = 0;
	m_subsetIndexToStageIndex.clear ();
	for(auto mesh : m_subsetMeshes) {

		m_subsetIndexToStageIndex.push_back ((int)m_renderer.num_stages());

		if (mesh->has (FACES)) {
			ComputeFaceVertexNormals3 (*mesh, "normals");
			CreateSideGrobs (*mesh, 1);

			m_renderer.add_stage ("solid", mesh, FACES, FLAT);
			m_renderer.stage_set_color (subset_color (subsetIndex));

			m_renderer.add_stage ("wire", mesh, EDGES, FLAT);
			m_renderer.stage_set_color (wireColor);
		}
		++subsetIndex;
	}
}